

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O1

void __thiscall
cbtIDebugDraw::drawCone
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar height,int upAxis,cbtTransform *transform,
          cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  cbtVector3 *pcVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 local_148 [8];
  float fStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  uint uStack_100;
  undefined1 local_f8 [8];
  uint uStack_f0;
  undefined1 local_e8 [8];
  uint uStack_e0;
  long local_d8;
  cbtVector3 *local_d0;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  long local_90;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  fVar1 = (transform->m_origin).m_floats[0];
  fVar2 = (transform->m_origin).m_floats[1];
  fVar3 = (transform->m_origin).m_floats[2];
  lVar18 = (long)upAxis;
  auVar22._0_12_ = ZEXT812(0);
  auVar22._12_4_ = 0;
  _local_148 = auVar22;
  local_d0 = color;
  *(float *)(local_148 + lVar18 * 4) = height * 0.5;
  local_d8 = (long)(upAxis + 1 + ((upAxis + 1) / 3) * -3);
  _local_a8 = auVar22;
  *(cbtScalar *)(local_a8 + local_d8 * 4) = radius;
  lVar19 = (long)(upAxis + 2 + ((upAxis + 2) / 3) * -3);
  _local_b8 = auVar22;
  *(cbtScalar *)(local_b8 + lVar19 * 4) = radius;
  auVar21._8_4_ = 0x80000000;
  auVar21._0_8_ = 0x8000000080000000;
  auVar21._12_4_ = 0x80000000;
  auVar21 = vxorps_avx512vl(ZEXT416((uint)(height * 0.5)),auVar21);
  _local_e8 = auVar22;
  local_90 = lVar18;
  *(int *)(local_e8 + lVar18 * 4) = auVar21._0_4_;
  local_128._0_4_ = local_148._0_4_;
  local_138._0_4_ = local_148._4_4_;
  uVar20 = 0xffffffe2;
  local_c8 = fStack_140;
  do {
    uVar20 = uVar20 + 0x1e;
    local_118._0_4_ = (float)(int)uVar20 * 0.017453292;
    fVar24 = sinf((float)(int)uVar20 * 0.017453292);
    *(float *)(local_e8 + local_d8 * 4) = fVar24 * radius;
    fVar24 = cosf((float)local_118._0_4_);
    *(float *)(local_e8 + lVar19 * 4) = fVar24 * radius;
    fVar24 = (transform->m_basis).m_el[0].m_floats[1];
    auVar23 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar24)),auVar23,
                              ZEXT416((uint)local_128._0_4_));
    auVar25 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
    auVar21 = vfmadd231ss_fma(auVar21,auVar25,ZEXT416((uint)local_c8));
    fVar4 = (transform->m_basis).m_el[1].m_floats[1];
    auVar26 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar4)),auVar26,
                              ZEXT416((uint)local_128._0_4_));
    auVar27 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
    auVar22 = vfmadd231ss_fma(auVar22,auVar27,ZEXT416((uint)local_c8));
    fVar5 = (transform->m_basis).m_el[2].m_floats[1];
    auVar29 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar5)),auVar29,
                              ZEXT416((uint)local_128._0_4_));
    auVar30 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
    auVar14 = vfmadd231ss_fma(auVar14,auVar30,ZEXT416((uint)local_c8));
    auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
    _local_f8 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (float)local_e8._4_4_)),
                              ZEXT416((uint)local_e8._0_4_),auVar23);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416(uStack_e0),auVar25);
    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_e8._4_4_)),
                              ZEXT416((uint)local_e8._0_4_),auVar26);
    auVar22 = vfmadd231ss_fma(auVar22,ZEXT416(uStack_e0),auVar27);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_e8._4_4_)),auVar29,
                              ZEXT416((uint)local_e8._0_4_));
    auVar14 = vfmadd231ss_fma(auVar14,auVar30,ZEXT416(uStack_e0));
    auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
    _local_108 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,local_f8,local_108,local_d0);
    pcVar15 = local_d0;
  } while (uVar20 < 0x14a);
  fVar24 = (transform->m_basis).m_el[0].m_floats[1];
  auVar23 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)((float)local_148._4_4_ * fVar24)),auVar23,
                            ZEXT416((uint)local_148._0_4_));
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar21 = vfmadd231ss_fma(auVar21,auVar25,ZEXT416((uint)fStack_140));
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar26 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)((float)local_148._4_4_ * fVar4)),auVar26,
                            ZEXT416((uint)local_148._0_4_));
  auVar27 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar22 = vfmadd231ss_fma(auVar22,auVar27,ZEXT416((uint)fStack_140));
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar29 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  local_128 = ZEXT416((uint)local_148._0_4_);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_148._4_4_ * fVar5)),auVar29,local_128);
  auVar30 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  local_118 = ZEXT416((uint)fStack_140);
  auVar14 = vfmadd231ss_fma(auVar14,auVar30,local_118);
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_f8 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  local_c8 = -(float)local_148._0_4_;
  uStack_c4 = 0x80000000;
  uStack_c0 = 0x80000000;
  uStack_bc = 0x80000000;
  local_138 = ZEXT416((uint)local_148._4_4_);
  local_78 = -(float)local_148._4_4_;
  uStack_74 = 0x80000000;
  uStack_70 = 0x80000000;
  uStack_6c = 0x80000000;
  local_88 = -fStack_140;
  uStack_84 = 0x80000000;
  uStack_80 = 0x80000000;
  uStack_7c = 0x80000000;
  uVar16 = local_a8._0_4_;
  uVar17 = local_a8._4_4_;
  fVar32 = (float)local_a8._0_4_ - (float)local_148._0_4_;
  fVar28 = (float)local_a8._4_4_ - (float)local_148._4_4_;
  fVar13 = fStack_a0;
  fVar12 = fStack_a0 - fStack_140;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * fVar28)),ZEXT416((uint)fVar32),auVar23);
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar12),auVar25);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar28)),ZEXT416((uint)fVar32),auVar26);
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar12),auVar27);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar28)),auVar29,ZEXT416((uint)fVar32));
  auVar14 = vfmadd231ss_fma(auVar14,auVar30,ZEXT416((uint)fVar12));
  auVar21 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar21);
  auVar22 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar22);
  auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
  _local_108 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_f8,local_108,local_d0);
  fVar24 = (transform->m_basis).m_el[0].m_floats[1];
  auVar23 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar24)),auVar23,local_128);
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar21 = vfmadd231ss_fma(auVar21,auVar25,local_118);
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar26 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar4)),auVar26,local_128);
  auVar27 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar22 = vfmadd231ss_fma(auVar22,auVar27,local_118);
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar29 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar5)),auVar29,local_128);
  auVar30 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar14 = vfmadd231ss_fma(auVar14,auVar30,local_118);
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_f8 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  fVar32 = local_c8 - (float)uVar16;
  fVar28 = local_78 - (float)uVar17;
  fVar13 = local_88 - fVar13;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar24)),ZEXT416((uint)fVar32),auVar23);
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar13),auVar25);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar4)),ZEXT416((uint)fVar32),auVar26);
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar13),auVar27);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar28)),auVar29,ZEXT416((uint)fVar32));
  auVar14 = vfmadd231ss_fma(auVar14,auVar30,ZEXT416((uint)fVar13));
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_108 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_f8,local_108,pcVar15);
  fVar24 = (transform->m_basis).m_el[0].m_floats[1];
  fVar32 = local_138._0_4_;
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * fVar24)),auVar25,local_128);
  auVar26 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar21 = vfmadd231ss_fma(auVar21,auVar26,local_118);
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar27 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * fVar4)),auVar27,local_128);
  auVar29 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar22 = vfmadd231ss_fma(auVar22,auVar29,local_118);
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar30 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar32 * fVar5)),auVar30,local_128);
  auVar31 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar14 = vfmadd231ss_fma(auVar14,auVar31,local_118);
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_f8 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  uVar16 = local_b8._0_4_;
  uVar17 = local_b8._4_4_;
  fVar32 = (float)local_b8._0_4_ - local_128._0_4_;
  auVar21 = vsubss_avx512f(ZEXT416((uint)local_b8._4_4_),local_138);
  fVar12 = fStack_b0;
  auVar23 = vsubss_avx512f(ZEXT416((uint)fStack_b0),local_118);
  fVar28 = auVar21._0_4_;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * fVar28)),ZEXT416((uint)fVar32),auVar25);
  auVar21 = vfmadd231ss_fma(auVar21,auVar23,auVar26);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar28)),ZEXT416((uint)fVar32),auVar27);
  auVar22 = vfmadd231ss_fma(auVar22,auVar23,auVar29);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar28)),auVar30,ZEXT416((uint)fVar32));
  auVar14 = vfmadd231ss_fma(auVar14,auVar31,auVar23);
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_108 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_f8,local_108,pcVar15);
  fVar24 = (transform->m_basis).m_el[0].m_floats[1];
  auVar23 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar24)),auVar23,local_128);
  auVar25 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
  auVar21 = vfmadd231ss_fma(auVar21,auVar25,local_118);
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar26 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar4)),auVar26,local_128);
  auVar27 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
  auVar22 = vfmadd231ss_fma(auVar22,auVar27,local_118);
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar29 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar5)),auVar29,local_128);
  auVar30 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
  auVar14 = vfmadd231ss_fma(auVar14,auVar30,local_118);
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_f8 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  fVar32 = local_c8 - (float)uVar16;
  fVar28 = local_78 - (float)uVar17;
  fVar12 = local_88 - fVar12;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar24)),ZEXT416((uint)fVar32),auVar23);
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar12),auVar25);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar4)),ZEXT416((uint)fVar32),auVar26);
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar12),auVar27);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar28)),auVar29,ZEXT416((uint)fVar32));
  auVar14 = vfmadd231ss_fma(auVar14,auVar30,ZEXT416((uint)fVar12));
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 + auVar22._0_4_)),0x10);
  _local_108 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 + auVar14._0_4_)),0x28);
  (*this->_vptr_cbtIDebugDraw[4])(this,local_f8,local_108,pcVar15);
  _local_f8 = ZEXT816(0);
  *(undefined4 *)(local_f8 + local_90 * 4) = 0x3f800000;
  _local_108 = ZEXT816(0);
  *(undefined4 *)(local_108 + local_d8 * 4) = 0x3f800000;
  cVar6 = (transform->m_basis).m_el[0].m_floats[0];
  fVar24 = (transform->m_basis).m_el[0].m_floats[1];
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar24)),ZEXT416((uint)cVar6),
                            local_128);
  cVar7 = (transform->m_basis).m_el[0].m_floats[2];
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar7),local_118);
  cVar8 = (transform->m_basis).m_el[1].m_floats[0];
  fVar4 = (transform->m_basis).m_el[1].m_floats[1];
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar4)),ZEXT416((uint)cVar8),
                            local_128);
  cVar9 = (transform->m_basis).m_el[1].m_floats[2];
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar9),local_118);
  cVar10 = (transform->m_basis).m_el[2].m_floats[0];
  fVar5 = (transform->m_basis).m_el[2].m_floats[1];
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * fVar5)),ZEXT416((uint)cVar10),
                            local_128);
  cVar11 = (transform->m_basis).m_el[2].m_floats[2];
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)cVar11),local_118);
  auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar21._0_4_)),
                          ZEXT416((uint)(fVar2 - auVar22._0_4_)),0x10);
  local_40 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar3 - auVar14._0_4_)),0x28);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (float)local_f8._4_4_)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)local_f8._0_4_));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar7),ZEXT416(uStack_f0));
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_f8._4_4_)),ZEXT416((uint)cVar8),
                            ZEXT416((uint)local_f8._0_4_));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar9),ZEXT416(uStack_f0));
  auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_f8._4_4_)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)local_f8._0_4_));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar11),ZEXT416(uStack_f0));
  local_50 = vinsertps_avx(auVar21,auVar22,0x28);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * (float)local_108._4_4_)),
                            ZEXT416((uint)local_108._0_4_),ZEXT416((uint)cVar6));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416(uStack_100),ZEXT416((uint)cVar7));
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_108._4_4_)),
                            ZEXT416((uint)local_108._0_4_),ZEXT416((uint)cVar8));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416(uStack_100),ZEXT416((uint)cVar9));
  auVar21 = vinsertps_avx(auVar21,auVar22,0x10);
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * (float)local_108._4_4_)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)local_108._0_4_));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar11),ZEXT416(uStack_100));
  local_60 = vinsertps_avx(auVar21,auVar22,0x28);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this);
  return;
}

Assistant:

virtual void drawCone(cbtScalar radius, cbtScalar height, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		int stepDegrees = 30;
		cbtVector3 start = transform.getOrigin();

		cbtVector3 offsetHeight(0, 0, 0);
		cbtScalar halfHeight = height * cbtScalar(0.5);
		offsetHeight[upAxis] = halfHeight;
		cbtVector3 offsetRadius(0, 0, 0);
		offsetRadius[(upAxis + 1) % 3] = radius;
		cbtVector3 offset2Radius(0, 0, 0);
		offset2Radius[(upAxis + 2) % 3] = radius;

		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = -halfHeight;

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * capEnd, color);
		}

		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight + offsetRadius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight - offsetRadius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight + offset2Radius), color);
		drawLine(start + transform.getBasis() * (offsetHeight), start + transform.getBasis() * (-offsetHeight - offset2Radius), color);

		// Drawing the base of the cone
		cbtVector3 yaxis(0, 0, 0);
		yaxis[upAxis] = cbtScalar(1.0);
		cbtVector3 xaxis(0, 0, 0);
		xaxis[(upAxis + 1) % 3] = cbtScalar(1.0);
		drawArc(start - transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, 10.0);
	}